

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

ctl_named_node_t * arena_i_index(tsdn_t *tsdn,size_t *mib,size_t miblen,size_t i)

{
  ctl_named_node_t *pcVar1;
  
  malloc_mutex_lock(tsdn,&ctl_mtx);
  if (((i & 0xfffffffffffffffe) == 0x1000) || (i <= ctl_arenas->narenas)) {
    pcVar1 = super_arena_i_node;
  }
  else {
    pcVar1 = (ctl_named_node_t *)0x0;
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return pcVar1;
}

Assistant:

static const ctl_named_node_t *
arena_i_index(tsdn_t *tsdn, const size_t *mib, size_t miblen,
    size_t i) {
	const ctl_named_node_t *ret;

	malloc_mutex_lock(tsdn, &ctl_mtx);
	switch (i) {
	case MALLCTL_ARENAS_ALL:
	case MALLCTL_ARENAS_DESTROYED:
		break;
	default:
		if (i > ctl_arenas->narenas) {
			ret = NULL;
			goto label_return;
		}
		break;
	}

	ret = super_arena_i_node;
label_return:
	malloc_mutex_unlock(tsdn, &ctl_mtx);
	return ret;
}